

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WhereNonZeroLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_wherenonzero(NeuralNetworkLayer *this)

{
  bool bVar1;
  WhereNonZeroLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_wherenonzero(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_wherenonzero(this);
    this_00 = (WhereNonZeroLayerParams *)operator_new(0x18);
    WhereNonZeroLayerParams::WhereNonZeroLayerParams(this_00);
    (this->layer_).wherenonzero_ = this_00;
  }
  return (WhereNonZeroLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::WhereNonZeroLayerParams* NeuralNetworkLayer::mutable_wherenonzero() {
  if (!has_wherenonzero()) {
    clear_layer();
    set_has_wherenonzero();
    layer_.wherenonzero_ = new ::CoreML::Specification::WhereNonZeroLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.whereNonZero)
  return layer_.wherenonzero_;
}